

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  bool bVar1;
  Address AVar2;
  Enum EVar3;
  Enum EVar4;
  ulong uVar5;
  Type local_7c;
  mapped_type *local_78;
  mapped_type *access;
  mapped_type *var;
  undefined1 local_60 [8];
  string name;
  Address byte_size;
  Node *addr_exp_local;
  uint64_t uStack_20;
  Address align_local;
  uint64_t offset_local;
  LoadStoreTracking *this_local;
  Type type_local;
  Opcode opc_local;
  
  uStack_20 = offset;
  offset_local = (uint64_t)this;
  this_local._0_4_ = type.enum_;
  this_local._4_4_ = opc.enum_;
  AVar2 = Opcode::GetMemorySize((Opcode *)((long)&this_local + 4));
  name.field_2._12_4_ = this_local._0_4_;
  name.field_2._8_4_ = this_local._4_4_;
  this_local._0_4_ = GetMemoryType(this_local._0_4_,this_local._4_4_);
  AddrExpName_abi_cxx11_((string *)local_60,this,addr_exp);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    var._4_4_ = 1;
    goto LAB_001d5662;
  }
  access = (mapped_type *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
           ::operator[](&this->vars,(key_type *)local_60);
  local_78 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[]((map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
                           *)access,&stack0xffffffffffffffe0);
  if (local_78->byte_size != 0) {
    if (local_78->byte_size == AVar2) {
      EVar3 = Type::operator_cast_to_Enum(&local_78->type);
      EVar4 = Type::operator_cast_to_Enum((Type *)&this_local);
      if ((EVar3 == EVar4) && (local_78->align == align)) goto LAB_001d5593;
    }
    local_78->is_uniform = false;
  }
LAB_001d5593:
  bVar1 = Opcode::IsNaturallyAligned((Opcode *)((long)&this_local + 4),align);
  if (!bVar1) {
    local_78->is_uniform = false;
  }
  local_78->byte_size = AVar2;
  (local_78->type).enum_ = this_local._0_4_;
  local_78->align = align;
  EVar3 = Type::operator_cast_to_Enum((Type *)&access[2].idx);
  EVar4 = Type::operator_cast_to_Enum((Type *)&this_local);
  if (EVar3 == EVar4) {
LAB_001d5602:
    if ((*(Address *)&access[2].is_uniform != align) && (*(int *)&access[2].is_uniform != -1))
    goto LAB_001d5638;
    access[2].idx = this_local._0_4_;
    *(Address *)&access[2].is_uniform = align;
    access[3].byte_size = this_local._4_4_;
  }
  else {
    EVar3 = Type::operator_cast_to_Enum((Type *)&access[2].idx);
    if (EVar3 == Any) goto LAB_001d5602;
LAB_001d5638:
    Type::Type(&local_7c,Void);
    access[2].idx = local_7c.enum_;
    *(undefined4 *)&access[2].is_uniform = 0xffffffff;
  }
  var._4_4_ = 0;
LAB_001d5662:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void LoadStore(uint64_t offset, Opcode opc, Type type, Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size &&
        ((access.byte_size != byte_size) ||
         (access.type != type) ||
         (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }